

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

void __thiscall
Js::DynamicProfileInfo::RecordAsmJsCallSiteInfo
          (DynamicProfileInfo *this,FunctionBody *callerBody,ProfileId callSiteId,
          FunctionBody *calleeBody)

{
  undefined1 *puVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  AsmJsFunctionInfo *pAVar6;
  CallSiteInfo *pCVar7;
  ScriptContext *pSVar8;
  ScriptContext *pSVar9;
  DWORD_PTR DVar10;
  DWORD_PTR DVar11;
  AutoCriticalSection local_50;
  AutoCriticalSection cs;
  Type local_40;
  LocalFunctionId local_34;
  
  local_50.cs = (CriticalSection *)callSiteInfoCS;
  CCLock::Enter((CCLock *)callSiteInfoCS);
  if ((((callerBody == (FunctionBody *)0x0) || (calleeBody == (FunctionBody *)0x0)) ||
      ((*(ushort *)&(callerBody->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 & 0x200
       ) == 0)) ||
     (((calleeBody->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 2) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x22c,"((0))",
                                "Call to RecordAsmJsCallSiteInfo without two asm.js/wasm FunctionBody"
                               );
    if (!bVar3) {
LAB_0088624a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  else {
    if ((this->persistsAcrossScriptContexts == false) && ((this->functionBody).ptr != callerBody)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x233,
                                  "(!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == callerBody)"
                                  ,
                                  "!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == callerBody"
                                 );
      if (!bVar3) goto LAB_0088624a;
      *puVar5 = 0;
    }
    pAVar6 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)2,Js::AsmJsFunctionInfo*>
                       ((FunctionProxy *)calleeBody);
    bVar3 = pAVar6->mArgCount < 0x10;
    if (callSiteId < 0x20 && calleeBody == callerBody) {
      this->m_recursiveInlineInfo = this->m_recursiveInlineInfo | 1 << ((byte)callSiteId & 0x1f);
    }
    pCVar7 = (this->callSiteInfo).ptr;
    if (*(short *)&pCVar7[callSiteId].field_0x2 < 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x244,"(!callSiteInfo[callSiteId].isPolymorphic)",
                                  "!callSiteInfo[callSiteId].isPolymorphic");
      if (!bVar4) goto LAB_0088624a;
      *puVar5 = 0;
      pCVar7 = (this->callSiteInfo).ptr;
    }
    cs.cs._0_4_ = pCVar7[callSiteId].u.functionData.sourceId;
    if ((Type)cs.cs != 0xfffffffc) {
      cs.cs._4_4_ = pCVar7[callSiteId].u.functionData.functionId;
      pSVar8 = FunctionProxy::GetScriptContext((FunctionProxy *)callerBody);
      pSVar9 = FunctionProxy::GetScriptContext((FunctionProxy *)calleeBody);
      local_34 = 0xfffffffe;
      local_40 = 0xfffffffc;
      if (pSVar8 == pSVar9) {
        DVar10 = FunctionProxy::GetSecondaryHostSourceContext((FunctionProxy *)callerBody);
        DVar11 = FunctionProxy::GetSecondaryHostSourceContext((FunctionProxy *)calleeBody);
        if (DVar10 == DVar11) {
          DVar10 = FunctionProxy::GetHostSourceContext((FunctionProxy *)callerBody);
          DVar11 = FunctionProxy::GetHostSourceContext((FunctionProxy *)calleeBody);
          if (DVar10 == DVar11) {
            local_40 = 0xfffffffd;
          }
          else {
            DVar10 = FunctionProxy::GetHostSourceContext((FunctionProxy *)calleeBody);
            local_40 = (Type)DVar10;
          }
          local_34 = FunctionProxy::GetLocalFunctionId((FunctionProxy *)calleeBody);
        }
      }
      if ((Type)cs.cs == 0xffffffff) {
        (this->callSiteInfo).ptr[callSiteId].u.functionData.sourceId = local_40;
        (this->callSiteInfo).ptr[callSiteId].u.functionData.functionId = local_34;
        this->currentInlinerVersion = this->currentInlinerVersion + '\x01';
      }
      else if (local_34 != cs.cs._4_4_ || (Type)cs.cs != local_40) {
        if (cs.cs._4_4_ != 0xffffffff) {
          this->currentInlinerVersion = this->currentInlinerVersion + '\x01';
        }
        (this->callSiteInfo).ptr[callSiteId].u.functionData.functionId = 0xffffffff;
        bVar3 = false;
      }
      puVar1 = &(this->callSiteInfo).ptr[callSiteId].field_0x2;
      *(ushort *)puVar1 = *(ushort *)puVar1 & 0xdfff;
      pCVar7 = (this->callSiteInfo).ptr;
      *(ushort *)&pCVar7[callSiteId].field_0x2 =
           *(ushort *)&pCVar7[callSiteId].field_0x2 & 0xbfff | ((byte)~bVar3 & 1) << 0xe;
      (this->callSiteInfo).ptr[callSiteId].ldFldInlineCacheId = 0xffffffff;
    }
  }
  AutoCriticalSection::~AutoCriticalSection(&local_50);
  return;
}

Assistant:

void DynamicProfileInfo::RecordAsmJsCallSiteInfo(FunctionBody* callerBody, ProfileId callSiteId, FunctionBody* calleeBody)
    {
        AutoCriticalSection cs(&this->callSiteInfoCS);

        if (!callerBody || !callerBody->GetIsAsmjsMode() || !calleeBody || !calleeBody->GetIsAsmjsMode())
        {
            AssertMsg(UNREACHED, "Call to RecordAsmJsCallSiteInfo without two asm.js/wasm FunctionBody");
            return;
        }

#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)
        // If we persistsAcrossScriptContext, the dynamic profile info may be referred to by multiple function body from
        // different script context
        Assert(!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == callerBody);
#endif

        bool doInline = true;
        // This is a hard limit as we only use 4 bits to encode the actual count in the InlineeCallInfo
        if (calleeBody->GetAsmJsFunctionInfo()->GetArgCount() > Js::InlineeCallInfo::MaxInlineeArgoutCount)
        {
            doInline = false;
        }

        // Mark the callsite bit where caller and callee is same function
        if (calleeBody == callerBody && callSiteId < 32)
        {
            this->m_recursiveInlineInfo = this->m_recursiveInlineInfo | (1 << callSiteId);
        }

        // TODO: support polymorphic inlining in wasm
        Assert(!callSiteInfo[callSiteId].isPolymorphic);
        Js::SourceId oldSourceId = callSiteInfo[callSiteId].u.functionData.sourceId;
        if (oldSourceId == InvalidSourceId)
        {
            return;
        }

        Js::LocalFunctionId oldFunctionId = callSiteInfo[callSiteId].u.functionData.functionId;

        Js::SourceId sourceId = InvalidSourceId;
        Js::LocalFunctionId functionId;
        // We can only inline function that are from the same script context
        if (callerBody->GetScriptContext() == calleeBody->GetScriptContext())
        {
            if (callerBody->GetSecondaryHostSourceContext() == calleeBody->GetSecondaryHostSourceContext())
            {
                if (callerBody->GetHostSourceContext() == calleeBody->GetHostSourceContext())
                {
                    sourceId = CurrentSourceId; // Caller and callee in same file
                }
                else
                {
                    sourceId = (Js::SourceId)calleeBody->GetHostSourceContext(); // Caller and callee in different files
                }
                functionId = calleeBody->GetLocalFunctionId();
            }
            else
            {
                // Pretend that we are cross context when call is crossing script file.
                functionId = CallSiteCrossContext;
            }
        }
        else
        {
            functionId = CallSiteCrossContext;
        }

        if (oldSourceId == NoSourceId)
        {
            callSiteInfo[callSiteId].u.functionData.sourceId = sourceId;
            callSiteInfo[callSiteId].u.functionData.functionId = functionId;
            this->currentInlinerVersion++; // we don't mind if this overflows
        }
        else if (oldSourceId != sourceId || oldFunctionId != functionId)
        {
            if (oldFunctionId != CallSiteMixed)
            {
                this->currentInlinerVersion++; // we don't mind if this overflows
            }

            callSiteInfo[callSiteId].u.functionData.functionId = CallSiteMixed;
            doInline = false;
        }
        callSiteInfo[callSiteId].isConstructorCall = false;
        callSiteInfo[callSiteId].dontInline = !doInline;
        callSiteInfo[callSiteId].ldFldInlineCacheId = Js::Constants::NoInlineCacheIndex;
    }